

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

int flipConePdr(Aig_Man_t *pAig,int directive,int targetCSPropertyIndex,int safetyInvariantPOIndex,
               int absorberCount)

{
  char *__s;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  int iVar3;
  Pdr_Par_t Pars;
  
  __s = (char *)malloc(0x32);
  iVar3 = 0;
  sprintf(__s,"%s_%d.%s","kLive",absorberCount,"blif");
  if (((uint)directive < 5) && ((0x1aU >> (directive & 0x1fU) & 1) != 0)) {
    if (safetyInvariantPOIndex == -1) {
      __assert_fail("safetyInvariantPOIndex != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                    ,0x164,"int flipConePdr(Aig_Man_t *, int, int, int, int)");
    }
    modifyAigToApplySafetyInvar(pAig,targetCSPropertyIndex,safetyInvariantPOIndex);
  }
  p = Aig_ManDupSimple(pAig);
  for (; iVar3 < p->nTruePos; iVar3 = iVar3 + 1) {
    pAVar1 = Aig_ManCo(p,iVar3);
    Aig_ObjChild0Flip(pAVar1);
  }
  Pdr_ManSetDefaultParams(&Pars);
  Pars.fVerbose = 1;
  p->vSeqModelVec = (Vec_Ptr_t *)0x0;
  Pars.fNotVerbose = Pars.fVerbose;
  Pars.fSolveAll = Pars.fVerbose;
  Aig_ManCleanup(p);
  iVar3 = Aig_ManCheck(p);
  if (iVar3 != 0) {
    Pdr_ManSolve(p,&Pars);
    if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      pvVar2 = Vec_PtrEntry(p->vSeqModelVec,targetCSPropertyIndex);
      free(__s);
      for (iVar3 = 0; iVar3 < p->nTruePos; iVar3 = iVar3 + 1) {
        pAVar1 = Aig_ManCo(p,iVar3);
        Aig_ObjChild0Flip(pAVar1);
      }
      Aig_ManStop(p);
      return (int)(pvVar2 == (void *)0x0);
    }
    exit(0);
  }
  __assert_fail("Aig_ManCheck( pAig )",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                ,0x178,"int flipConePdr(Aig_Man_t *, int, int, int, int)");
}

Assistant:

int flipConePdr( Aig_Man_t *pAig, int directive, int targetCSPropertyIndex, int safetyInvariantPOIndex, int absorberCount )
{
	int RetValue, i;
	Aig_Obj_t *pObjTargetPo;
	Aig_Man_t *pAigDupl;
	Pdr_Par_t Pars, * pPars = &Pars;
	Abc_Cex_t * pCex = NULL;

	char *fileName;
	
	fileName = (char *)malloc(sizeof(char) * 50);
	sprintf(fileName, "%s_%d.%s", "kLive", absorberCount, "blif" );

	if( directive == kCS_WITH_SAFETY_INVARIANTS || directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS || directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS )
	{
		assert( safetyInvariantPOIndex != -1 );
		modifyAigToApplySafetyInvar(pAig, targetCSPropertyIndex, safetyInvariantPOIndex);
	}

	pAigDupl = pAig;
	pAig = Aig_ManDupSimple( pAigDupl );

	for( i=0; i<Saig_ManPoNum(pAig); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAig, i );
		Aig_ObjChild0Flip( pObjTargetPo );
	}

	Pdr_ManSetDefaultParams( pPars );
	pPars->fVerbose = 1;
	pPars->fNotVerbose = 1;
	pPars->fSolveAll = 1;
	pAig->vSeqModelVec = NULL;

	Aig_ManCleanup( pAig );
	assert( Aig_ManCheck( pAig ) );

	Pdr_ManSolve( pAig, pPars );	

	if( pAig->vSeqModelVec )
	{
		pCex = (Abc_Cex_t *)Vec_PtrEntry( pAig->vSeqModelVec, targetCSPropertyIndex );
		if( pCex == NULL )
		{
			RetValue = 1;
		}
		else
			RetValue = 0;
	}
	else
	{
		RetValue = -1;
		exit(0);
	}

	free(fileName);

	for( i=0; i<Saig_ManPoNum(pAig); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAig, i );
		Aig_ObjChild0Flip( pObjTargetPo );
	}
	
	Aig_ManStop( pAig );
	return RetValue;
}